

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O1

ostringstream * toml::detail::format_line(ostringstream *oss,size_t lnw,size_t linenum,string *line)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  ostream *poVar6;
  int c;
  uint uVar7;
  size_type sVar8;
  string local_50;
  
  local_50._M_dataplus._M_p._0_1_ = ' ';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,(char *)&local_50,1);
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[01m",5);
  }
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[34m",5);
  }
  lVar2 = *(long *)poVar6;
  *(long *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = (long)(int)lnw;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," | ",3);
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[00m",5);
  }
  sVar3 = line->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (line->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      cVar1 = pcVar4[sVar8];
      uVar7 = (uint)cVar1;
      iVar5 = isgraph(uVar7);
      if ((uVar7 == 0x20) || (iVar5 != 0)) {
        local_50._M_dataplus._M_p._0_1_ = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,(char *)&local_50,1);
      }
      else {
        show_char_abi_cxx11_(&local_50,(detail *)(ulong)uVar7,c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)oss,
                   (char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p)
                   ,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar3 != sVar8);
  }
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,(char *)&local_50,1);
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream& format_line(std::ostringstream& oss,
    const std::size_t lnw, const std::size_t linenum, const std::string& line)
{
    // 10 | key = "value"
    oss << ' ' << color::bold << color::blue
        << std::setw(static_cast<int>(lnw))
        << std::right << linenum << " | "  << color::reset;
    for(const char c : line)
    {
        if(std::isgraph(c) || c == ' ')
        {
            oss << c;
        }
        else
        {
            oss << show_char(c);
        }
    }
    oss << '\n';
    return oss;
}